

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

int sys_isabsolutepath(char *dir)

{
  char *dir_local;
  
  if ((*dir == '/') || (*dir == '~')) {
    dir_local._4_4_ = 1;
  }
  else {
    dir_local._4_4_ = 0;
  }
  return dir_local._4_4_;
}

Assistant:

int sys_isabsolutepath(const char *dir)
{
    if (dir[0] == '/' || dir[0] == '~'
#ifdef _WIN32
        || dir[0] == '%' || (dir[1] == ':' && dir[2] == '/')
#endif
        )
    {
        return 1;
    }
    else
    {
        return 0;
    }
}